

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O0

double HighsIntegers::integralScale(double *vals,HighsInt numVals,double deltadown,double deltaup)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  int64_t iVar5;
  int in_ESI;
  double *in_RDI;
  HighsCDouble *this;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar6;
  undefined1 auVar7 [16];
  double in_XMM1_Qa;
  undefined1 auVar8 [16];
  HighsCDouble HVar9;
  HighsInt i;
  uint64_t currgcd;
  HighsCDouble fraction;
  HighsCDouble downval;
  HighsCDouble val;
  int64_t startdenom;
  uint64_t denom;
  int expMaxVal;
  int expshift;
  double maxval;
  double minval;
  pair<const_double_*,_const_double_*> minmax;
  HighsCDouble *in_stack_fffffffffffffda8;
  HighsCDouble *in_stack_fffffffffffffdb0;
  HighsCDouble local_1d8;
  HighsCDouble in_stack_fffffffffffffe38;
  double in_stack_fffffffffffffe48;
  double local_1a8;
  double dStack_1a0;
  HighsCDouble local_198;
  HighsCDouble local_188;
  HighsCDouble local_178;
  HighsCDouble local_168;
  double local_158;
  double local_150;
  HighsCDouble local_148;
  HighsCDouble local_138;
  int local_124;
  HighsCDouble *local_120;
  HighsCDouble local_118;
  HighsCDouble local_108;
  double local_f8;
  double local_f0;
  HighsCDouble local_e8;
  HighsCDouble local_d8;
  HighsCDouble local_c8;
  HighsCDouble local_b8;
  HighsCDouble local_a8;
  HighsCDouble local_98;
  HighsCDouble local_88;
  ulong local_78;
  ulong local_70;
  int local_64;
  int local_60 [3];
  int local_54;
  double local_50;
  double local_48;
  pair<const_double_*,_const_double_*> local_38;
  double local_28;
  double local_20;
  int local_14;
  double *local_10;
  double local_8;
  
  if (in_ESI == 0) {
    local_8 = 0.0;
  }
  else {
    local_28 = in_XMM1_Qa;
    local_20 = in_XMM0_Qa;
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_38 = std::
               minmax_element<double_const*,HighsIntegers::integralScale(double_const*,int,double,double)::_lambda(double,double)_1_>
                         (in_RDI,in_RDI + in_ESI);
    local_48 = *local_38.first;
    local_50 = *local_38.second;
    local_54 = 0;
    if ((local_48 < -local_20) || (local_28 < local_48)) {
      frexp(local_48,&local_54);
    }
    local_60[2] = -local_54;
    local_60[1] = 0;
    piVar4 = std::max<int>(local_60 + 2,local_60 + 1);
    local_54 = *piVar4 + 3;
    frexp(local_50,local_60);
    local_64 = 0x20;
    piVar4 = std::min<int>(local_60,&local_64);
    local_60[0] = *piVar4;
    if (0x20 < local_60[0] + local_54) {
      local_54 = 0x20 - local_60[0];
    }
    local_78 = 0x4bL << ((byte)local_54 & 0x3f);
    local_70 = local_78;
    HighsCDouble::HighsCDouble(&local_98,*local_10);
    local_88 = ::operator*((double)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_b8 = HighsCDouble::operator+(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
    dVar6 = local_b8.lo;
    local_a8.hi = floor(local_b8.hi);
    local_a8.lo = dVar6;
    local_c8 = HighsCDouble::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
    if (bVar2) {
      HighsCDouble::operator_cast_to_double(&local_c8);
      iVar5 = denominator(in_stack_fffffffffffffe48,in_stack_fffffffffffffe38.lo,
                          (int64_t)in_stack_fffffffffffffe38.hi);
      local_70 = local_70 * iVar5;
      HighsCDouble::HighsCDouble(&local_e8,*local_10);
      local_d8 = ::operator*((double)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_88 = local_d8;
      local_108 = HighsCDouble::operator+
                            (in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      dVar6 = local_108.lo;
      local_f8 = floor(local_108.hi);
      local_f0 = dVar6;
      local_a8.hi = local_f8;
      local_a8.lo = dVar6;
      local_118 = HighsCDouble::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_c8 = local_118;
      bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      if (bVar2) {
        return 0.0;
      }
    }
    this = &local_a8;
    HighsCDouble::operator_cast_to_double(this);
    std::abs((int)this);
    local_120 = (HighsCDouble *)
                ((long)extraout_XMM0_Qa |
                (long)(extraout_XMM0_Qa - 9.223372036854776e+18) & (long)extraout_XMM0_Qa >> 0x3f);
    local_124 = 1;
    while( true ) {
      if (local_124 == local_14) break;
      HighsCDouble::HighsCDouble(&local_148,local_10[local_124]);
      local_138 = ::operator*((double)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_88 = local_138;
      local_168 = HighsCDouble::operator+
                            (in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      dVar6 = local_168.lo;
      local_158 = floor(local_168.hi);
      local_150 = dVar6;
      local_a8.hi = local_158;
      local_a8.lo = dVar6;
      local_178 = HighsCDouble::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_c8 = local_178;
      bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      if (bVar2) {
        HighsCDouble::HighsCDouble(&local_198,local_10[local_124]);
        local_188 = ::operator*((double)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        local_88.lo = local_188.lo;
        local_88.hi = local_188.hi;
        dVar6 = floor(local_188.hi);
        HVar9 = HighsCDouble::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        local_1a8 = HVar9.hi;
        dStack_1a0 = HVar9.lo;
        local_c8.hi = local_1a8;
        local_c8.lo = dStack_1a0;
        HighsCDouble::operator_cast_to_double(&local_c8);
        iVar5 = denominator(dVar6,in_stack_fffffffffffffe38.lo,(int64_t)in_stack_fffffffffffffe38.hi
                           );
        local_70 = local_70 * iVar5;
        HighsCDouble::HighsCDouble(&local_1d8,local_10[local_124]);
        in_stack_fffffffffffffe38 =
             ::operator*((double)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        local_88 = in_stack_fffffffffffffe38;
        HVar9 = HighsCDouble::operator+(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8)
        ;
        dVar6 = HVar9.lo;
        local_a8.hi = floor(HVar9.hi);
        local_a8.lo = dVar6;
        local_c8 = HighsCDouble::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8)
        ;
        if (bVar2) {
          return 0.0;
        }
      }
      if (local_120 != (HighsCDouble *)0x1) {
        in_stack_fffffffffffffdb0 = local_120;
        dVar6 = HighsCDouble::operator_cast_to_double(&local_a8);
        local_120 = (HighsCDouble *)gcd((int64_t)in_stack_fffffffffffffdb0,(long)dVar6);
        uVar1 = local_70;
        uVar3 = std::numeric_limits<unsigned_int>::max();
        if (uVar3 < uVar1) {
          local_70 = local_70 / (ulong)local_120;
          if (local_78 != 1) {
            iVar5 = gcd((int64_t)local_120,local_78);
            local_78 = (long)local_78 / iVar5;
          }
          local_120 = (HighsCDouble *)0x1;
        }
      }
      local_124 = local_124 + 1;
    }
    auVar7._8_4_ = (int)(local_70 >> 0x20);
    auVar7._0_8_ = local_70;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)((ulong)local_120 >> 0x20);
    auVar8._0_8_ = local_120;
    auVar8._12_4_ = 0x45300000;
    local_8 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0)) /
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_120) - 4503599627370496.0));
  }
  return local_8;
}

Assistant:

static double integralScale(const double* vals, HighsInt numVals,
                              double deltadown, double deltaup) {
    if (numVals == 0) return 0.0;

    auto minmax = std::minmax_element(
        vals, vals + numVals,
        [](double a, double b) { return std::abs(a) < std::abs(b); });
    const double minval = *minmax.first;
    const double maxval = *minmax.second;

    int expshift = 0;

    // to cover many small denominators at once use a denominator of 75 * 2^n
    // with n-3 being large enough so that the smallest value is not below 0.5
    // but ignore tiny values bew deltadown/deltaup.
    if (minval < -deltadown || minval > deltaup) std::frexp(minval, &expshift);
    expshift = std::max(-expshift, 0) + 3;

    // guard against making the largest value too big which may cause overflows
    // with intermediate gcd values
    int expMaxVal;
    std::frexp(maxval, &expMaxVal);
    expMaxVal = std::min(expMaxVal, 32);
    if (expMaxVal + expshift > 32) expshift = 32 - expMaxVal;

    uint64_t denom = uint64_t{75} << expshift;
    int64_t startdenom = denom;
    // now check if the values are integral and if not compute a common
    // denominator for their remaining fraction
    HighsCDouble val = startdenom * HighsCDouble(vals[0]);
    HighsCDouble downval = floor(val + deltaup);
    HighsCDouble fraction = val - downval;

    if (fraction > deltadown) {
      // use a continued fraction algorithm to compute small missing
      // denominators for the remaining fraction
      denom *= denominator(double(fraction), deltaup, 1000);
      val = denom * HighsCDouble(vals[0]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      // if this is not sufficient for reaching integrality, we stop here
      if (fraction > deltadown) return 0.0;
    }

    uint64_t currgcd = (uint64_t)std::abs(double(downval));

    for (HighsInt i = 1; i != numVals; ++i) {
      val = denom * HighsCDouble(vals[i]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      if (fraction > deltadown) {
        val = startdenom * HighsCDouble(vals[i]);
        fraction = val - floor(val);
        denom *= denominator(double(fraction), deltaup, 1000);
        val = denom * HighsCDouble(vals[i]);
        downval = floor(val + deltaup);
        fraction = val - downval;

        if (fraction > deltadown) return 0.0;
      }

      if (currgcd != 1) {
        currgcd = gcd(currgcd, (int64_t) double(downval));

        // if the denominator is large, divide by the current gcd to prevent
        // unnecessary overflows
        if (denom > std::numeric_limits<unsigned int>::max()) {
          denom /= currgcd;
          if (startdenom != 1) startdenom /= gcd(currgcd, startdenom);
          currgcd = 1;
        }
      }
    }

    return static_cast<double>(denom) / static_cast<double>(currgcd);
  }